

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

cio_error write_response(cio_http_client *client,cio_http_status_code status_code,
                        cio_write_buffer *wbh_body,cio_response_written_cb_t written_cb)

{
  anon_union_16_2_70f96463_for_data *paVar1;
  size_t *psVar2;
  cio_write_buffer *pcVar3;
  void *pvVar4;
  cio_write_buffer *pcVar5;
  size_t sVar6;
  cio_write_buffer *pcVar7;
  cio_write_buffer *pcVar8;
  int iVar9;
  cio_error cVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  
  if ((client->http_private).response_written == false) {
    client->response_written_cb = written_cb;
    (client->http_private).response_fired = true;
    if (wbh_body == (cio_write_buffer *)0x0) {
      sVar12 = 0;
    }
    else {
      sVar12 = (wbh_body->data).element.length;
    }
    pcVar13 = (client->http_private).content_length_buffer;
    iVar9 = snprintf(pcVar13,0x1d,"Content-Length: %zu\r\n",sVar12);
    pcVar5 = &(client->http_private).wb_http_content_length;
    (client->http_private).wb_http_content_length.data.head.q_len = (size_t)pcVar13;
    *(long *)((long)&(client->http_private).wb_http_content_length.data + 8) = (long)iVar9;
    pcVar8 = &client->response_wbh;
    pcVar3 = (client->response_wbh).prev;
    (client->http_private).wb_http_content_length.next = pcVar8;
    (client->http_private).wb_http_content_length.prev = pcVar3;
    pcVar3->next = pcVar5;
    (client->response_wbh).prev = pcVar5;
    sVar6 = (client->response_wbh).data.element.length;
    sVar12 = (client->http_private).wb_http_content_length.data.element.length;
    (client->response_wbh).data.head.q_len = (client->response_wbh).data.head.q_len + 1;
    (client->response_wbh).data.element.length = sVar12 + sVar6;
    if (((status_code == CIO_HTTP_STATUS_BAD_REQUEST) ||
        (status_code == CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR)) ||
       (status_code == CIO_HTTP_STATUS_TIMEOUT)) {
      (client->http_private).close_immediately = true;
    }
    pvVar4 = (client->parser).data;
    cVar10 = cio_timer_expires_from_now
                       (&(client->http_private).response_timer,*(uint64_t *)((long)pvVar4 + 0xa0),
                        client_timeout_handler,client);
    if (cVar10 == CIO_SUCCESS) {
      if (status_code == CIO_HTTP_STATUS_SWITCHING_PROTOCOLS) {
        pcVar13 = "HTTP/1.1 101 Switching Protocols\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_TIMEOUT) {
        pcVar13 = "HTTP/1.1 408 Request Timeout\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_BAD_REQUEST) {
        pcVar13 = "HTTP/1.1 400 Bad Request\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_NOT_FOUND) {
        pcVar13 = "HTTP/1.1 404 Not Found\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_OK) {
        pcVar13 = "HTTP/1.1 200 OK\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else {
        pcVar13 = "HTTP/1.1 500 Internal Server Error\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      sVar11 = strlen(pcVar13);
      (client->http_private).wb_http_response_statusline.data.head.q_len = (size_t)pcVar13;
      (client->http_private).wb_http_response_statusline.data.element.length = sVar11;
      pcVar5 = (client->response_wbh).next;
      (client->http_private).wb_http_response_statusline.next = pcVar5;
      (client->http_private).wb_http_response_statusline.prev = pcVar8;
      (client->response_wbh).next = &(client->http_private).wb_http_response_statusline;
      pcVar5->prev = &(client->http_private).wb_http_response_statusline;
      sVar6 = (client->response_wbh).data.element.length;
      sVar12 = (client->http_private).wb_http_response_statusline.data.element.length;
      (client->response_wbh).data.head.q_len = (client->response_wbh).data.head.q_len + 1;
      (client->response_wbh).data.element.length = sVar12 + sVar6;
      if (status_code == CIO_HTTP_STATUS_SWITCHING_PROTOCOLS) {
        (client->http_private).wb_http_connection_header.data.head.q_len =
             (size_t)"Connection: Upgrade\r\n";
        (client->http_private).wb_http_connection_header.data.element.length = 0x15;
      }
      else if (((client->http_private).should_keepalive == true) &&
              ((client->http_private).close_immediately == false)) {
        (client->http_private).wb_http_connection_header.data.head.q_len =
             (size_t)"Connection: keep-alive\r\n";
        (client->http_private).wb_http_connection_header.data.element.length = 0x18;
        pcVar5 = &(client->http_private).wb_http_keepalive_header;
        pcVar13 = (char *)((long)(client->parser).data + 0x128);
        sVar11 = strlen(pcVar13);
        (client->http_private).wb_http_keepalive_header.data.head.q_len = (size_t)pcVar13;
        (client->http_private).wb_http_keepalive_header.data.element.length = sVar11;
        pcVar3 = (client->response_wbh).prev;
        (client->http_private).wb_http_keepalive_header.next = pcVar8;
        (client->http_private).wb_http_keepalive_header.prev = pcVar3;
        pcVar3->next = pcVar5;
        (client->response_wbh).prev = pcVar5;
        sVar6 = (client->response_wbh).data.element.length;
        sVar12 = (client->http_private).wb_http_keepalive_header.data.element.length;
        (client->response_wbh).data.head.q_len = (client->response_wbh).data.head.q_len + 1;
        (client->response_wbh).data.element.length = sVar12 + sVar6;
      }
      else {
        (client->http_private).wb_http_connection_header.data.head.q_len =
             (size_t)"Connection: close\r\n";
        (client->http_private).wb_http_connection_header.data.element.length = 0x13;
      }
      pcVar5 = &(client->http_private).wb_http_connection_header;
      pcVar3 = (client->response_wbh).prev;
      (client->http_private).wb_http_connection_header.prev = pcVar3;
      pcVar3->next = pcVar5;
      pcVar3 = &(client->http_private).wb_http_response_header_end;
      paVar1 = &(client->response_wbh).data;
      (paVar1->head).q_len = (paVar1->head).q_len + 2;
      sVar12 = (client->response_wbh).data.element.length;
      sVar6 = (client->http_private).wb_http_connection_header.data.element.length;
      (client->http_private).wb_http_response_header_end.data.head.q_len = (size_t)"\r\n";
      (client->http_private).wb_http_response_header_end.data.element.length = 2;
      (client->http_private).wb_http_response_header_end.next = pcVar8;
      (client->http_private).wb_http_response_header_end.prev = pcVar5;
      (client->http_private).wb_http_connection_header.next = pcVar3;
      (client->response_wbh).prev = pcVar3;
      (client->response_wbh).data.element.length = sVar12 + sVar6 + 2;
      if ((wbh_body != (cio_write_buffer *)0x0) && (pcVar5 = wbh_body->next, pcVar5 != wbh_body)) {
        pcVar7 = wbh_body->prev;
        (client->http_private).wb_http_response_header_end.next = pcVar5;
        pcVar5->prev = pcVar3;
        pcVar7->next = pcVar8;
        (client->response_wbh).prev = pcVar7;
        paVar1 = &(client->response_wbh).data;
        (paVar1->head).q_len = (paVar1->head).q_len + (wbh_body->data).head.q_len;
        psVar2 = &(client->response_wbh).data.element.length;
        *psVar2 = *psVar2 + (wbh_body->data).element.length;
        wbh_body->prev = wbh_body;
        wbh_body->next = wbh_body;
        wbh_body->data = (anon_union_16_2_70f96463_for_data)0x0;
      }
      (client->http_private).response_written = true;
      cVar10 = cio_buffered_stream_write(&client->buffered_stream,pcVar8,response_written,client);
      return cVar10;
    }
    paVar1 = &(client->response_wbh).data;
    (paVar1->head).q_len = (paVar1->head).q_len - 1;
    psVar2 = &(client->response_wbh).data.element.length;
    *psVar2 = *psVar2 - (client->http_private).wb_http_content_length.data.element.length;
    pcVar5 = (client->http_private).wb_http_content_length.next;
    pcVar8 = (client->http_private).wb_http_content_length.prev;
    pcVar5->prev = pcVar8;
    pcVar8->next = pcVar5;
    if (*(code **)((long)pvVar4 + 0xa8) != (code *)0x0) {
      (**(code **)((long)pvVar4 + 0xa8))(pvVar4,"Arming of response timer failed!");
    }
    mark_to_be_closed(client);
    cVar10 = CIO_SUCCESS;
  }
  else {
    cVar10 = CIO_OPERATION_NOT_PERMITTED;
  }
  return cVar10;
}

Assistant:

static enum cio_error write_response(struct cio_http_client *client, enum cio_http_status_code status_code, struct cio_write_buffer *wbh_body, cio_response_written_cb_t written_cb)
{
	if (cio_unlikely(client->http_private.response_written)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	client->response_written_cb = written_cb;
	client->http_private.response_fired = true;
	size_t content_length = 0;
	if (wbh_body) {
		content_length = cio_write_buffer_get_total_size(wbh_body);
	}

	int written = snprintf(client->http_private.content_length_buffer, sizeof(client->http_private.content_length_buffer) - 1, "Content-Length: %zu" CIO_CRLF, content_length);
	cio_write_buffer_element_init(&client->http_private.wb_http_content_length, client->http_private.content_length_buffer, (size_t)written);
	add_response_header(client, &client->http_private.wb_http_content_length);

	if ((status_code == CIO_HTTP_STATUS_BAD_REQUEST) || (status_code == CIO_HTTP_STATUS_TIMEOUT) || (status_code == CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR)) {
		client->http_private.close_immediately = true;
	}

	struct cio_http_server *server = cio_http_client_get_server(client);
	enum cio_error err = cio_timer_expires_from_now(&client->http_private.response_timer, server->response_timeout_ns, client_timeout_handler, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		cio_write_buffer_unlink(&client->response_wbh, &client->http_private.wb_http_content_length);
		handle_error(server, "Arming of response timer failed!");
		mark_to_be_closed(client);
		return 0;
	}

	start_response_header(client, status_code);
	end_response_header(client);
	if (wbh_body) {
		cio_write_buffer_splice(wbh_body, &client->response_wbh);
	}

	client->http_private.response_written = true;
	return flush(client, response_written);
}